

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_ast_t * mpc_ast_build(int n,char *tag,...)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  char in_AL;
  mpc_ast_t *pmVar4;
  mpc_ast_t **__ptr;
  undefined8 in_RCX;
  void **ppvVar5;
  uint uVar6;
  undefined8 in_RDX;
  ulong uVar7;
  int iVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pmVar4 = mpc_ast_new(tag,"");
  local_100 = &va[0].overflow_arg_area;
  uVar6 = 0x10;
  if (0 < n) {
    iVar1 = pmVar4->children_num;
    __ptr = pmVar4->children;
    iVar8 = 0;
    sVar3 = (long)iVar1 * 8;
    do {
      uVar7 = (ulong)uVar6;
      if (uVar7 < 0x29) {
        uVar6 = uVar6 + 8;
        ppvVar5 = (void **)((long)local_e8 + uVar7);
      }
      else {
        ppvVar5 = local_100;
        local_100 = local_100 + 1;
      }
      pvVar2 = *ppvVar5;
      __ptr = (mpc_ast_t **)realloc(__ptr,sVar3 + 8);
      *(void **)((long)__ptr + sVar3) = pvVar2;
      iVar8 = iVar8 + -1;
      sVar3 = sVar3 + 8;
    } while (-n != iVar8);
    pmVar4->children_num = iVar1 - iVar8;
    pmVar4->children = __ptr;
  }
  return pmVar4;
}

Assistant:

mpc_ast_t *mpc_ast_build(int n, const char *tag, ...) {

  mpc_ast_t *a = mpc_ast_new(tag, "");

  int i;
  va_list va;
  va_start(va, tag);

  for (i = 0; i < n; i++) {
    mpc_ast_add_child(a, va_arg(va, mpc_ast_t*));
  }

  va_end(va);

  return a;

}